

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecrt.cpp
# Opt level: O0

int PAL_fseek(PAL_FILE *pf,LONG lOffset,int nWhence)

{
  int iVar1;
  FILE *local_28;
  int nRet;
  int nWhence_local;
  LONG lOffset_local;
  PAL_FILE *pf_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (pf == (PAL_FILE *)0x0) {
    local_28 = (FILE *)0x0;
  }
  else {
    local_28 = (FILE *)pf->bsdFilePtr;
  }
  iVar1 = fseek(local_28,(long)lOffset,nWhence);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return iVar1;
}

Assistant:

int
_cdecl
PAL_fseek(
    PAL_FILE * pf,
    LONG lOffset,
    int nWhence
    )
{
    int nRet = 0;

    PERF_ENTRY(fseek);
    ENTRY( "fseek( %p, %ld, %d )\n", pf, lOffset, nWhence );

    nRet = fseek(pf ? pf->bsdFilePtr : NULL, lOffset, nWhence);

    LOGEXIT("fseek returning %d\n", nRet);
    PERF_EXIT(fseek);
    return nRet;
}